

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

void __thiscall Vault::Config::Config(Config *this)

{
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30 [4];
  Config *local_10;
  Config *this_local;
  
  this->tls_ = true;
  this->debug_ = false;
  this->verify_ = true;
  local_30[3] = 10;
  local_10 = this;
  Tiny<Vault::TimeoutDetail,_long>::Tiny(&this->connectTimeout_,local_30 + 3);
  local_30[2] = 10;
  Tiny<Vault::TimeoutDetail,_long>::Tiny(&this->requestTimeout_,local_30 + 2);
  local_30[1] = 10;
  Tiny<Vault::TimeoutDetail,_long>::Tiny(&this->lowSpeedTimeout_,local_30 + 1);
  local_30[0] = 0x3c;
  Tiny<Vault::ThresholdDetail,_long>::Tiny(&this->lowSpeedLimit_,local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"localhost",&local_51);
  Tiny<Vault::HostDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&this->host_,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"8200",&local_89);
  Tiny<Vault::PortDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&this->port_,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
  Tiny<Vault::NamespaceDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&this->ns_,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  Catch::clara::std::filesystem::__cxx11::path::path(&this->caBundle_);
  return;
}

Assistant:

Config()
      : tls_(true), debug_(false), verify_(true), connectTimeout_(Timeout{10}),
        requestTimeout_(Timeout{10}), lowSpeedTimeout_(Timeout{10}),
        lowSpeedLimit_(Threshold{60}), host_(Host{"localhost"}),
        port_(Port{"8200"}), ns_(""), caBundle_() {}